

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O1

int nsync_mu_is_reader(nsync_mu *mu)

{
  uint uVar1;
  
  uVar1 = mu->word;
  if ((uVar1 & 0xffffff01) == 0) {
    nsync_panic_("nsync_mu not held in some mode\n");
  }
  return ~uVar1 & 1;
}

Assistant:

int nsync_mu_is_reader (const nsync_mu *mu) {
	uint32_t word;
	IGNORE_RACES_START ();
	word = ATM_LOAD (&mu->word);
	if ((word & MU_ANY_LOCK) == 0) {
		nsync_panic_ ("nsync_mu not held in some mode\n");
	}
	IGNORE_RACES_END ();
	return ((word & MU_WLOCK) == 0);
}